

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O0

Up __thiscall yactfr::FixedLengthUnsignedIntegerType::_clone(FixedLengthUnsignedIntegerType *this)

{
  Mappings *args_6;
  FixedLengthBitArrayType *in_RSI;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  DisplayBase local_34;
  BitOrder local_30;
  ByteOrder local_2c;
  ByteOrder local_28;
  uint local_24;
  unique_ptr<const_yactfr::FixedLengthUnsignedIntegerType,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  local_20 [2];
  FixedLengthUnsignedIntegerType *this_local;
  
  this_local = this;
  local_24 = DataType::alignment((DataType *)in_RSI);
  local_28 = FixedLengthBitArrayType::length(in_RSI);
  local_2c = FixedLengthBitArrayType::byteOrder(in_RSI);
  local_30 = FixedLengthBitArrayType::bitOrder(in_RSI);
  local_34 = IntegerTypeCommon<unsigned_long_long>::preferredDisplayBase
                       ((IntegerTypeCommon<unsigned_long_long> *)(in_RSI + 1));
  args_6 = IntegerTypeCommon<unsigned_long_long>::mappings_abi_cxx11_
                     ((IntegerTypeCommon<unsigned_long_long> *)(in_RSI + 1));
  DataType::attributes((DataType *)in_RSI);
  internal::tryCloneAttrs((MapItem *)&local_40);
  UnsignedIntegerTypeCommon::roles
            ((UnsignedIntegerTypeCommon *)&in_RSI[2].super_ScalarDataType.super_DataType._attrs);
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,std::set<yactfr::UnsignedIntegerTypeRole,std::less<yactfr::UnsignedIntegerTypeRole>,std::allocator<yactfr::UnsignedIntegerTypeRole>>const&>
            ((uint *)local_20,&local_24,&local_28,&local_2c,&local_30,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)&local_34,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             args_6,(set<yactfr::UnsignedIntegerTypeRole,_std::less<yactfr::UnsignedIntegerTypeRole>,_std::allocator<yactfr::UnsignedIntegerTypeRole>_>
                     *)&local_40);
  std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
  unique_ptr<yactfr::FixedLengthUnsignedIntegerType_const,std::default_delete<yactfr::FixedLengthUnsignedIntegerType_const>,void>
            ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)this,
             local_20);
  std::
  unique_ptr<const_yactfr::FixedLengthUnsignedIntegerType,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  ::~unique_ptr(local_20);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_40);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthUnsignedIntegerType::_clone() const
{
    return FixedLengthUnsignedIntegerType::create(this->alignment(), this->length(),
                                                  this->byteOrder(), this->bitOrder(),
                                                  this->preferredDisplayBase(), this->mappings(),
                                                  internal::tryCloneAttrs(this->attributes()),
                                                  this->roles());
}